

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O0

boolean breaktest(obj *obj)

{
  short sVar1;
  boolean bVar2;
  obj *obj_local;
  
  bVar2 = obj_resists(obj,1,99);
  if (bVar2 == '\0') {
    if ((((*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f) == 0x13) &&
        (obj->oartifact == '\0')) && (obj->oclass != '\r')) {
      obj_local._7_1_ = '\x01';
    }
    else {
      if (obj->oclass == '\b') {
        sVar1 = 0x14f;
      }
      else {
        sVar1 = obj->otyp;
      }
      if ((((sVar1 == 0xea) || (sVar1 == 0x10f)) ||
          ((sVar1 == 0x119 || ((sVar1 == 0x120 || (sVar1 == 0x14f)))))) ||
         (sVar1 == 0x218 || sVar1 == 0x219)) {
        obj_local._7_1_ = '\x01';
      }
      else {
        obj_local._7_1_ = '\0';
      }
    }
  }
  else {
    obj_local._7_1_ = '\0';
  }
  return obj_local._7_1_;
}

Assistant:

boolean breaktest(struct obj *obj)
{
	if (obj_resists(obj, 1, 99)) return 0;
	if (objects[obj->otyp].oc_material == GLASS && !obj->oartifact &&
		obj->oclass != GEM_CLASS)
	    return 1;
	switch (obj->oclass == POTION_CLASS ? POT_WATER : obj->otyp) {
		case EXPENSIVE_CAMERA:
		case POT_WATER:		/* really, all potions */
		case EGG:
		case CREAM_PIE:
		case MELON:
		case ACID_VENOM:
		case BLINDING_VENOM:
			return 1;
		default:
			return 0;
	}
}